

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::strengthenInequalities
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt *num_strengthened)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  uint uVar6;
  int *piVar7;
  iterator __position;
  Result RVar8;
  HighsLp *pHVar9;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  iterator __beg;
  int *piVar13;
  iterator __begin3;
  pointer piVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  double dVar23;
  undefined8 uVar24;
  double dVar25;
  HighsInt pos;
  vector<double,_std::allocator<double>_> reducedcost;
  vector<int,_std::allocator<int>_> indices;
  double ub;
  double weight;
  vector<int,_std::allocator<int>_> stack;
  vector<int,_std::allocator<int>_> positions;
  vector<int,_std::allocator<int>_> cover;
  vector<double,_std::allocator<double>_> upper;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<double,_std::allocator<double>_> coefs;
  char local_231;
  double local_230;
  int local_224;
  double local_220;
  vector<double,_std::allocator<double>_> local_218;
  undefined1 local_1f8 [16];
  double local_1e0;
  vector<int,_std::allocator<int>_> local_1d8;
  double local_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  HighsCDouble local_1a8;
  vector<int,_std::allocator<int>_> local_198;
  vector<int,_std::allocator<int>_> local_178;
  int *local_158;
  iterator iStack_150;
  int *local_148;
  vector<double,_std::allocator<double>_> local_138;
  double local_118;
  double local_110;
  char *local_108;
  iterator iStack_100;
  char *local_f8;
  double local_e8;
  int local_dc;
  double local_d8;
  undefined4 uStack_d0;
  uint uStack_cc;
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  vector<double,_std::allocator<double>_> local_a8;
  int *local_88;
  HighsPostsolveStack *local_80;
  ulong local_78;
  HPresolve *local_70;
  pointer local_68;
  HighsOptions *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  ulong uStack_40;
  
  local_108 = (char *)0x0;
  iStack_100._M_current = (char *)0x0;
  RVar8 = kOk;
  local_f8 = (char *)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148 = (int *)0x0;
  local_158 = (int *)0x0;
  iStack_150._M_current = (int *)0x0;
  *num_strengthened = 0;
  pHVar9 = this->model;
  local_88 = num_strengthened;
  local_80 = postsolve_stack;
  if (pHVar9->num_row_ != 0) {
    uVar18 = 0;
    local_70 = this;
    do {
      uVar1 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18];
      if (1 < (long)(int)uVar1) {
        local_1b8 = (pHVar9->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar18];
        uStack_1b0 = 0;
        if ((local_1b8 <= -INFINITY) ||
           (INFINITY <=
            (pHVar9->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18])) {
          uVar6 = (pHVar9->num_col_ - this->numDeletedCols) / 0x14;
          if ((int)uVar6 < 0x3e9) {
            uVar6 = 1000;
          }
          if (uVar1 <= uVar6) {
            local_e8 = -1.0;
            if (local_1b8 <= -INFINITY) {
              local_1b8 = -(pHVar9->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar18];
              uStack_1b0 = 0x8000000000000000;
              local_e8 = 1.0;
            }
            if (iStack_100._M_current != local_108) {
              iStack_100._M_current = local_108;
            }
            if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                      ((vector<signed_char,_std::allocator<signed_char>_> *)&local_108,
                       (long)(int)uVar1);
            std::vector<double,_std::allocator<double>_>::reserve
                      (&local_218,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18]);
            std::vector<double,_std::allocator<double>_>::reserve
                      (&local_138,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18]);
            std::vector<int,_std::allocator<int>_>::reserve
                      (&local_1d8,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18]);
            std::vector<int,_std::allocator<int>_>::reserve
                      (&local_178,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18]);
            std::vector<int,_std::allocator<int>_>::reserve
                      (&local_198,
                       (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar18]);
            piVar11 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar18;
            if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_198,
                         (iterator)
                         local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,piVar11);
            }
            else {
              *local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *piVar11;
              local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar19 = true;
            if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_1e0 = 0.0;
              local_c8 = 0.0;
              uStack_c0 = 0;
              local_118 = 0.0;
            }
            else {
              local_118 = 0.0;
              local_c8 = 0.0;
              uStack_c0 = 0;
              local_1e0 = 0.0;
              do {
                __position._M_current =
                     local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
                local_224 = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish[-1];
                piVar3 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar12 = piVar3[local_224];
                if (iVar12 != -1) {
                  if (__position._M_current ==
                      local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = __position._M_current;
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_198,__position,
                               piVar3 + local_224);
                    __position._M_current =
                         local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                  }
                  else {
                    local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1] = iVar12;
                    __position._M_current =
                         local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                  }
                }
                local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current;
                piVar3 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar12 = piVar3[local_224];
                if (iVar12 != -1) {
                  if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_198,
                               (iterator)
                               local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,piVar3 + local_224);
                  }
                  else {
                    *local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar12;
                    local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                pHVar9 = this->model;
                iVar12 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_224];
                pdVar4 = (pHVar9->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((pdVar4[iVar12] <= -INFINITY) ||
                   (pdVar5 = (pHVar9->col_upper_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start, INFINITY <= pdVar5[iVar12])) {
                  bVar19 = false;
                  break;
                }
                local_1a8.hi = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[local_224] * local_e8;
                local_1c0 = pdVar5[iVar12] - pdVar4[iVar12];
                if (local_1a8.hi <= 0.0) {
                  dVar22 = pdVar4[iVar12] * local_1a8.hi;
                  dVar23 = local_1b8 + dVar22;
                  local_1f8._0_8_ =
                       (local_1b8 - (dVar23 - dVar22)) + (dVar22 - (dVar23 - (dVar23 - dVar22)));
                  local_1a8.hi = -local_1a8.hi;
                  local_231 = -1;
                  local_1b8 = dVar23;
                }
                else {
                  dVar22 = pdVar5[iVar12] * local_1a8.hi;
                  dVar23 = local_1b8 + dVar22;
                  local_1f8._0_8_ =
                       (local_1b8 - (dVar23 - dVar22)) + (dVar22 - (dVar23 - (dVar23 - dVar22)));
                  local_231 = '\x01';
                  local_1b8 = dVar23;
                }
                if ((this->primal_feastol < local_1c0) && (this->primal_feastol < local_1a8.hi)) {
                  if ((pHVar9->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar12] == kContinuous) {
                    dVar22 = local_1c0 * local_1a8.hi;
                    dVar23 = local_c8 + dVar22;
                    local_118 = local_118 +
                                (local_c8 - (dVar23 - dVar22)) +
                                (dVar22 - (dVar23 - (dVar23 - dVar22)));
                    local_c8 = dVar23;
                  }
                  else {
                    local_dc = (int)((ulong)((long)local_218.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_218.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                (&local_1d8,
                                 (iterator)
                                 local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&local_dc);
                    }
                    else {
                      *local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_dc;
                      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_178,
                                 (iterator)
                                 local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&local_224);
                    }
                    else {
                      *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_224;
                      local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&local_218,
                                 (iterator)
                                 local_218.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_1a8.hi);
                    }
                    else {
                      *local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_1a8.hi;
                      local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (iStack_100._M_current == local_f8) {
                      std::vector<signed_char,std::allocator<signed_char>>::
                      _M_realloc_insert<signed_char_const&>
                                ((vector<signed_char,std::allocator<signed_char>> *)&local_108,
                                 iStack_100,&local_231);
                    }
                    else {
                      *iStack_100._M_current = local_231;
                      iStack_100._M_current = iStack_100._M_current + 1;
                    }
                    if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&local_138,
                                 (iterator)
                                 local_138.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_1c0);
                    }
                    else {
                      *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_1c0;
                      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                }
                local_1e0 = local_1e0 + (double)local_1f8._0_8_;
              } while (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            if ((((uVar18 & 100) == 0) ||
                ((int)uVar6 <
                 (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18] * 10)) &&
               (RVar8 = checkTimeLimit(this), RVar8 != kOk)) goto LAB_00317ba2;
            if (bVar19) {
              dVar22 = this->primal_feastol;
              uVar20 = SUB84(dVar22,0);
              uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
              if (local_1b8 + local_1e0 <= dVar22) {
                RVar8 = rowPresolve(this,local_80,(HighsInt)uVar18);
                if (RVar8 != kOk) goto LAB_00317ba2;
              }
              else {
                local_220 = (local_1b8 + local_1e0) * dVar22;
                if (local_220 <= dVar22 * 100.0) {
                  local_220 = dVar22 * 100.0;
                }
                local_48 = -local_c8;
                uStack_40 = uStack_c0 ^ 0x8000000000000000;
                dVar22 = local_1b8 - local_c8;
                local_1f8._0_8_ =
                     ((local_48 - (dVar22 - local_1b8)) +
                      (local_1b8 - (dVar22 - (dVar22 - local_1b8))) + local_1e0) - local_118;
                local_1f8._8_8_ = uStack_40;
                uVar24 = uStack_1b0;
                uVar10 = uVar18;
                if (local_220 < dVar22 + (double)local_1f8._0_8_) {
                  do {
                    local_78 = uVar10;
                    dVar23 = local_1b8;
                    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start ==
                        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) break;
                    uVar10 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2;
                    iVar12 = 0;
                    if (1 < uVar10) {
                      iVar12 = 0;
                      do {
                        uVar10 = (long)uVar10 >> 1;
                        iVar12 = iVar12 + 1;
                      } while (1 < uVar10);
                    }
                    local_230 = dVar22;
                    pdqsort_detail::
                    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_218,iVar12,true);
                    if (iStack_150._M_current != local_158) {
                      iStack_150._M_current = local_158;
                    }
                    std::vector<int,_std::allocator<int>_>::reserve
                              ((vector<int,_std::allocator<int>_> *)&local_158,
                               (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 2);
                    dVar22 = local_230;
                    if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start != 0) {
                      lVar16 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 2;
                      do {
                        iVar12 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar16 + -1];
                        local_1a8.hi = (double)CONCAT44(local_1a8.hi._4_4_,iVar12);
                        dVar23 = local_138.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar12] *
                                 local_218.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar12];
                        dVar25 = dVar22 - dVar23;
                        if (((1000.0 < local_138.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar12]) ||
                            (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar12] <= local_220)) ||
                           (local_220 <
                            (-dVar23 - (dVar25 - dVar22)) + (dVar22 - (dVar25 - (dVar25 - dVar22)))
                            + (double)local_1f8._0_8_ + dVar25)) {
                          uVar20 = local_1f8._12_4_;
                          local_1f8._8_4_ = local_1f8._8_4_;
                          local_1f8._0_8_ =
                               (double)local_1f8._0_8_ +
                               (dVar22 - (dVar23 + dVar25)) +
                               (-dVar23 - (dVar25 - (dVar23 + dVar25)));
                          local_1f8._12_4_ = uVar20;
                          dVar22 = dVar25;
                        }
                        else if (iStack_150._M_current == local_148) {
                          local_230 = dVar22;
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    ((vector<int,std::allocator<int>> *)&local_158,iStack_150,
                                     (int *)&local_1a8);
                          dVar22 = local_230;
                        }
                        else {
                          *iStack_150._M_current = iVar12;
                          iStack_150._M_current = iStack_150._M_current + 1;
                        }
                        lVar16 = lVar16 + -1;
                      } while (lVar16 != 0);
                    }
                    dVar23 = local_1b8;
                    if (local_158 == iStack_150._M_current) break;
                    piVar13 = local_158;
                    piVar11 = local_158;
                    if (dVar22 + (double)local_1f8._0_8_ <= local_220) break;
                    while (piVar7 = piVar13, piVar11 = piVar11 + 1, piVar11 != iStack_150._M_current
                          ) {
                      dVar23 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[*piVar11];
                      dVar25 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[*piVar7];
                      if ((dVar23 <= 0.001) || (dVar25 <= 0.001)) {
                        bVar19 = dVar23 < dVar25;
                      }
                      else {
                        bVar19 = dVar25 < dVar23;
                      }
                      piVar13 = piVar11;
                      if (bVar19 || dVar25 == dVar23) {
                        piVar13 = piVar7;
                      }
                    }
                    local_b8 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[*piVar7];
                    local_230 = dVar22;
                    local_110 = dVar22 + (double)local_1f8._0_8_;
                    std::vector<double,_std::allocator<double>_>::resize
                              (&local_a8,(long)iStack_150._M_current - (long)local_158 >> 2);
                    local_1a8.hi = local_230;
                    local_1a8.lo = (double)local_1f8._0_8_;
                    HighsCDouble::operator/=(&local_1a8,local_b8);
                    dVar22 = local_1a8.hi - this->primal_feastol;
                    dVar22 = ceil((-this->primal_feastol - (dVar22 - local_1a8.hi)) +
                                  (local_1a8.hi - (dVar22 - (dVar22 - local_1a8.hi))) + local_1a8.lo
                                  + dVar22);
                    pdVar5 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    piVar11 = local_158;
                    pdVar4 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_58 = 1.0;
                    if (1.0 <= dVar22) {
                      local_58 = dVar22;
                    }
                    uStack_50 = 0;
                    local_1f8._8_8_ = 0x8000000000000000;
                    local_1f8._0_8_ = -local_58;
                    local_1c0 = INFINITY;
                    lVar16 = (long)iStack_150._M_current - (long)local_158;
                    if (lVar16 == 0) {
                      local_230 = 0.0;
                    }
                    else {
                      local_60 = this->options;
                      local_68 = local_a8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                      local_230 = 0.0;
                      lVar17 = 0;
                      do {
                        iVar12 = piVar11[lVar17];
                        uVar20 = SUB84(local_110,0);
                        uVar21 = (undefined4)((ulong)local_110 >> 0x20);
                        dVar22 = pdVar4[iVar12];
                        if (dVar22 <= local_110) {
                          uVar20 = SUB84(dVar22,0);
                          uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
                        }
                        local_d8 = (double)local_1f8._0_8_;
                        dVar22 = ceil((double)CONCAT44(uVar21,uVar20) / local_b8 -
                                      (local_60->super_HighsOptionsStruct).small_matrix_value);
                        local_68[lVar17] = dVar22;
                        dVar23 = pdVar5[iVar12] * dVar22;
                        local_1f8._0_8_ = (double)local_1f8._0_8_ + dVar23;
                        local_230 = local_230 +
                                    (local_d8 - ((double)local_1f8._0_8_ - dVar23)) +
                                    (dVar23 - ((double)local_1f8._0_8_ -
                                              ((double)local_1f8._0_8_ - dVar23)));
                        dVar22 = pdVar4[iVar12] / dVar22;
                        if (local_1c0 <= dVar22) {
                          dVar22 = local_1c0;
                        }
                        lVar17 = lVar17 + 1;
                        local_1c0 = dVar22;
                      } while (lVar16 >> 2 != lVar17);
                    }
                    local_1a8.hi = local_1b8;
                    local_1a8.lo = local_1e0;
                    HighsCDouble::operator/=(&local_1a8,local_58);
                    this = local_70;
                    uVar18 = local_78;
                    local_d8 = local_1a8.hi + local_1a8.lo;
                    if (local_1c0 <= local_1a8.hi + local_1a8.lo) {
                      local_d8 = local_1c0;
                    }
                    local_224 = (int)((ulong)((long)local_218.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_218.
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    local_1c0 = local_d8;
                    if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&local_218,
                                 (iterator)
                                 local_218.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_1c0);
                    }
                    else {
                      *local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_d8;
                      local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_1a8.hi = (double)local_1f8._0_8_ + local_230;
                    if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (&local_138,
                                 (iterator)
                                 local_138.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_1a8.hi);
                    }
                    else {
                      *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_1a8.hi;
                      local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if ((long)iStack_150._M_current - (long)local_158 != 0) {
                      lVar16 = 0;
                      do {
                        local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[local_158[lVar16]] =
                             local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[local_158[lVar16]] -
                             local_1c0 *
                             local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar16];
                        lVar16 = lVar16 + 1;
                      } while ((long)iStack_150._M_current - (long)local_158 >> 2 != lVar16);
                    }
                    uVar10 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                    piVar11 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (0 < (long)uVar10 >> 4) {
                      dVar22 = this->primal_feastol;
                      uVar20 = SUB84(dVar22,0);
                      uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
                      piVar13 = (int *)((uVar10 & 0xfffffffffffffff0) +
                                       (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                      lVar16 = ((long)uVar10 >> 4) + 1;
                      piVar11 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + 2;
                      do {
                        if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar11[-2]] <= dVar22) {
                          piVar11 = piVar11 + -2;
                          goto LAB_0031742e;
                        }
                        if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar11[-1]] <= dVar22) {
                          piVar11 = piVar11 + -1;
                          goto LAB_0031742e;
                        }
                        if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[*piVar11] <= dVar22) goto LAB_0031742e;
                        if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar11[1]] <= dVar22) {
                          piVar11 = piVar11 + 1;
                          goto LAB_0031742e;
                        }
                        lVar16 = lVar16 + -1;
                        piVar11 = piVar11 + 4;
                      } while (1 < lVar16);
                      uVar10 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish - (long)piVar13;
                      piVar11 = piVar13;
                    }
                    lVar16 = (long)uVar10 >> 2;
                    if (lVar16 == 3) {
                      dVar22 = this->primal_feastol;
                      uVar20 = SUB84(dVar22,0);
                      uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
                      if (dVar22 < local_218.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[*piVar11]) {
                        piVar11 = piVar11 + 1;
                        goto LAB_00317408;
                      }
LAB_0031742e:
                      piVar13 = piVar11 + 1;
                      if (piVar13 !=
                          local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish &&
                          piVar11 !=
                          local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
                        do {
                          if ((double)CONCAT44(uVar21,uVar20) <
                              local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[*piVar13]) {
                            *piVar11 = *piVar13;
                            piVar11 = piVar11 + 1;
                          }
                          piVar13 = piVar13 + 1;
                        } while (piVar13 !=
                                 local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish);
                      }
                      if (piVar11 !=
                          local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
                        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish = piVar11;
                      }
                    }
                    else {
                      if (lVar16 == 2) {
                        uVar20 = SUB84(this->primal_feastol,0);
                        uVar21 = (undefined4)((ulong)this->primal_feastol >> 0x20);
LAB_00317408:
                        if ((double)CONCAT44(uVar21,uVar20) <
                            local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[*piVar11]) {
                          piVar11 = piVar11 + 1;
                          goto LAB_00317416;
                        }
                        goto LAB_0031742e;
                      }
                      if (lVar16 == 1) {
                        uVar20 = SUB84(this->primal_feastol,0);
                        uVar21 = (undefined4)((ulong)this->primal_feastol >> 0x20);
LAB_00317416:
                        if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[*piVar11] <=
                            (double)CONCAT44(uVar21,uVar20)) goto LAB_0031742e;
                      }
                    }
                    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_1d8,
                                 (iterator)
                                 local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&local_224);
                    }
                    else {
                      *local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_224;
                      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    dVar22 = local_58 * local_d8;
                    dVar23 = local_1b8 - dVar22;
                    local_1e0 = local_1e0 +
                                (local_1b8 - (dVar22 + dVar23)) +
                                (-dVar22 - (dVar23 - (dVar22 + dVar23)));
                    dVar22 = dVar23 - local_c8;
                    local_1f8._0_8_ =
                         ((local_48 - (dVar22 - dVar23)) + (dVar23 - (dVar22 - (dVar22 - dVar23))) +
                         local_1e0) - local_118;
                    local_1f8._8_8_ = uStack_40;
                    local_1b8 = dVar23;
                    uVar10 = local_78;
                  } while (local_220 < dVar22 + (double)local_1f8._0_8_);
                  uVar20 = SUB84(this->primal_feastol,0);
                  uVar21 = (undefined4)((ulong)this->primal_feastol >> 0x20);
                  local_1b8 = dVar23;
                  uVar24 = uStack_1b0;
                }
                dVar22 = local_1b8 + (double)CONCAT44(uVar21,uVar20);
                dVar22 = ((double)CONCAT44(uVar21,uVar20) - (dVar22 - local_1b8)) +
                         (local_1b8 - (dVar22 - (dVar22 - local_1b8))) + local_1e0 + dVar22;
                uVar10 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
                piVar11 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (0 < (long)uVar10 >> 4) {
                  uVar15 = (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2;
                  piVar13 = (int *)((uVar10 & 0xfffffffffffffff0) +
                                   (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
                  lVar16 = ((long)uVar10 >> 4) + 1;
                  piVar11 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 2;
                  do {
                    if ((uVar15 <= (ulong)(long)piVar11[-2]) ||
                       (ABS(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar11[-2]]) <= dVar22)) {
                      piVar11 = piVar11 + -2;
                      goto LAB_00317741;
                    }
                    if ((uVar15 <= (ulong)(long)piVar11[-1]) ||
                       (ABS(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar11[-1]]) <= dVar22)) {
                      piVar11 = piVar11 + -1;
                      goto LAB_00317741;
                    }
                    if ((uVar15 <= (ulong)(long)*piVar11) ||
                       (ABS(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[*piVar11]) <= dVar22))
                    goto LAB_00317741;
                    if ((uVar15 <= (ulong)(long)piVar11[1]) ||
                       (ABS(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[piVar11[1]]) <= dVar22)) {
                      piVar11 = piVar11 + 1;
                      goto LAB_00317741;
                    }
                    lVar16 = lVar16 + -1;
                    piVar11 = piVar11 + 4;
                  } while (1 < lVar16);
                  uVar10 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar13;
                  piVar11 = piVar13;
                }
                lVar16 = (long)uVar10 >> 2;
                if (lVar16 == 3) {
                  uVar10 = (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2;
                  if (((ulong)(long)*piVar11 < uVar10) &&
                     (dVar22 < ABS(local_218.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[*piVar11]))) {
                    piVar11 = piVar11 + 1;
                    goto LAB_00317af9;
                  }
LAB_00317741:
                  if (piVar11 !=
                      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    piVar13 = piVar11 + 1;
                    if (piVar13 !=
                        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      do {
                        iVar12 = *piVar13;
                        if (((ulong)(long)iVar12 <
                             (ulong)((long)local_178.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_178.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 2)) &&
                           (dVar22 < ABS(local_218.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[iVar12]))) {
                          *piVar11 = iVar12;
                          piVar11 = piVar11 + 1;
                        }
                        piVar13 = piVar13 + 1;
                      } while (piVar13 !=
                               local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
                    }
                    if (piVar11 !=
                        local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = piVar11;
                    }
                  }
                }
                else {
                  if (lVar16 == 2) {
                    uVar10 = (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2;
LAB_00317af9:
                    if (((ulong)(long)*piVar11 < uVar10) &&
                       (dVar22 < ABS(local_218.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start[*piVar11]))) {
                      piVar11 = piVar11 + 1;
                      goto LAB_00317b26;
                    }
                    goto LAB_00317741;
                  }
                  if (lVar16 == 1) {
                    uVar10 = (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2;
LAB_00317b26:
                    if ((uVar10 <= (ulong)(long)*piVar11) ||
                       (ABS(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[*piVar11]) <= dVar22))
                    goto LAB_00317741;
                  }
                }
                piVar3 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                uStack_1b0 = uVar24;
                if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  uStack_1b0._0_4_ = (undefined4)uVar24;
                  uStack_1b0._4_4_ = (uint)((ulong)uVar24 >> 0x20);
                  uStack_cc = uStack_1b0._4_4_ ^ 0x80000000;
                  local_d8 = -local_1b8;
                  uStack_d0 = (undefined4)uStack_1b0;
                  if (0.0 <= local_e8) {
                    local_1f8._0_8_ =
                         (this->model->row_upper_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar18];
                    local_230 = 0.0;
                    piVar14 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    do {
                      iVar12 = *piVar14;
                      dVar22 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[iVar12] - local_1b8;
                      dVar22 = (((local_218.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar12] -
                                 (local_1b8 + dVar22)) +
                                (local_d8 - (dVar22 - (local_1b8 + dVar22)))) - local_1e0) + dVar22;
                      iVar2 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar12]];
                      if (local_108[iVar12] == -1) {
                        dVar25 = (this->model->col_lower_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2] * dVar22;
                        dVar23 = (double)local_1f8._0_8_ + dVar25;
                        local_220 = ((double)local_1f8._0_8_ - (dVar23 - dVar25)) +
                                    (dVar25 - (dVar23 - (dVar23 - dVar25)));
                      }
                      else {
                        dVar25 = (this->model->col_upper_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar2] * dVar22;
                        dVar23 = (double)local_1f8._0_8_ - dVar25;
                        local_220 = ((double)local_1f8._0_8_ - (dVar25 + dVar23)) +
                                    (-dVar25 - (dVar23 - (dVar25 + dVar23)));
                        dVar22 = -dVar22;
                      }
                      local_1f8._0_8_ = dVar23;
                      addToMatrix(this,(HighsInt)uVar18,iVar2,dVar22);
                      local_230 = local_230 + local_220;
                      piVar14 = piVar14 + 1;
                    } while (piVar14 != piVar3);
                    dVar22 = (double)local_1f8._0_8_ + local_230;
                    lVar16 = 0x68;
                  }
                  else {
                    local_230 = (this->model->row_lower_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar18];
                    local_220 = 0.0;
                    piVar14 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    do {
                      iVar12 = *piVar14;
                      dVar22 = local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[iVar12] - local_1b8;
                      dVar22 = (((local_218.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar12] -
                                 (local_1b8 + dVar22)) +
                                (local_d8 - (dVar22 - (local_1b8 + dVar22)))) - local_1e0) + dVar22;
                      local_b8 = -dVar22;
                      uVar20 = (undefined4)((ulong)local_b8 >> 0x20);
                      iVar2 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar12]];
                      if (local_108[iVar12] == -1) {
                        local_b8 = (this->model->col_lower_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar2] * local_b8;
                        local_1f8._0_8_ = local_230 + local_b8;
                        local_110 = (double)local_1f8._0_8_ - local_b8;
                        local_b8 = local_b8 - ((double)local_1f8._0_8_ - local_110);
                      }
                      else {
                        local_b8 = local_b8 *
                                   (this->model->col_upper_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar2];
                        local_1f8._0_8_ = local_230 - local_b8;
                        local_110 = local_b8 + (double)local_1f8._0_8_;
                        local_b8 = -local_b8 - ((double)local_1f8._0_8_ - local_110);
                        uVar20 = (undefined4)((ulong)dVar22 >> 0x20);
                      }
                      uStack_b0 = 0;
                      addToMatrix(this,(HighsInt)uVar18,iVar2,
                                  (double)CONCAT44(uVar20,SUB84(dVar22,0)));
                      local_220 = local_220 + (local_230 - local_110) + local_b8;
                      piVar14 = piVar14 + 1;
                      local_230 = (double)local_1f8._0_8_;
                    } while (piVar14 != piVar3);
                    dVar22 = (double)local_1f8._0_8_ + local_220;
                    lVar16 = 0x50;
                  }
                  *(double *)(*(long *)((long)&this->model->num_col_ + lVar16) + uVar18 * 8) =
                       dVar22;
                  *local_88 = *local_88 +
                              (int)((ulong)((long)local_1d8.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_1d8.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
                }
              }
            }
            else if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish !=
                     local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) {
              local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
          }
        }
      }
      uVar18 = uVar18 + 1;
      pHVar9 = this->model;
    } while (uVar18 != (uint)pHVar9->num_row_);
    RVar8 = kOk;
LAB_00317ba2:
    if (local_158 != (int *)0x0) {
      operator_delete(local_158);
    }
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108 != (char *)0x0) {
    operator_delete(local_108);
  }
  return RVar8;
}

Assistant:

HPresolve::Result HPresolve::strengthenInequalities(
    HighsPostsolveStack& postsolve_stack, HighsInt& num_strengthened) {
  std::vector<int8_t> complementation;
  std::vector<double> reducedcost;
  std::vector<double> upper;
  std::vector<HighsInt> indices;
  std::vector<HighsInt> positions;
  std::vector<HighsInt> stack;
  std::vector<double> coefs;
  std::vector<HighsInt> cover;

  num_strengthened = 0;
  // Check for timeout according to this frequency
  const HighsInt check_time_frequency = 100;

  for (HighsInt row = 0; row != model->num_row_; ++row) {
    if (rowsize[row] <= 1) continue;
    if (model->row_lower_[row] != -kHighsInf &&
        model->row_upper_[row] != kHighsInf)
      continue;

    // do not run on very dense rows as this could get expensive
    HighsInt rowsize_limit =
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);
    if (rowsize[row] > rowsize_limit) continue;

    // printf("strengthening knapsack of %" HIGHSINT_FORMAT " vars\n",
    // rowsize[row]);

    HighsCDouble maxviolation;
    HighsCDouble continuouscontribution = 0.0;
    double scale;

    if (model->row_lower_[row] != -kHighsInf) {
      // ax >= lb, treat as -ax <= -lb --> -ax + lb <= 0
      maxviolation = model->row_lower_[row];
      scale = -1.0;
    } else {
      // ax <= ub --> ax - ub <= 0
      maxviolation = -model->row_upper_[row];
      scale = 1.0;
    }

    complementation.clear();
    reducedcost.clear();
    upper.clear();
    indices.clear();
    positions.clear();
    complementation.reserve(rowsize[row]);
    reducedcost.reserve(rowsize[row]);
    upper.reserve(rowsize[row]);
    indices.reserve(rowsize[row]);
    positions.reserve(rowsize[row]);
    stack.reserve(rowsize[row]);
    stack.push_back(rowroot[row]);

    bool skiprow = false;

    while (!stack.empty()) {
      // pop element from stack
      HighsInt pos = stack.back();
      stack.pop_back();

      // add non-zeros to stack
      if (ARright[pos] != -1) stack.push_back(ARright[pos]);
      if (ARleft[pos] != -1) stack.push_back(ARleft[pos]);

      // get column index
      HighsInt col = Acol[pos];

      // skip row if a column bound is not finite
      skiprow = model->col_lower_[col] == -kHighsInf ||
                model->col_upper_[col] == kHighsInf;
      if (skiprow) break;

      // compute maximum violation
      // scale =  1:  ax <=  ub --> violation =  ax - ub > 0
      // scale = -1: -ax <= -lb --> violation = -ax + lb > 0
      // this means that for scale = 1 we sum up an upper bound on constraint
      // activity, and for scale = -1 we sum up a lower bound on constraint
      // activity.
      int8_t comp;
      double weight = Avalue[pos] * scale;
      double ub = model->col_upper_[col] - model->col_lower_[col];
      if (weight > 0) {
        comp = 1;
        maxviolation += model->col_upper_[col] * weight;
      } else {
        comp = -1;
        maxviolation += model->col_lower_[col] * weight;
        weight = -weight;
      }

      if (ub <= primal_feastol || weight <= primal_feastol) continue;

      if (model->integrality_[col] == HighsVarType::kContinuous) {
        continuouscontribution += weight * ub;
        continue;
      }

      indices.push_back(reducedcost.size());
      positions.push_back(pos);
      reducedcost.push_back(weight);
      complementation.push_back(comp);
      upper.push_back(ub);
    }

    // Check for timeout according to frequency, unless a particularly
    // dense row has just been analysed
    if ((row & check_time_frequency) == 0 || 10 * rowsize[row] > rowsize_limit)
      HPRESOLVE_CHECKED_CALL(checkTimeLimit());

    if (skiprow) {
      stack.clear();
      continue;
    }

    // maxviolation <= 0 implies that the constraint is redundant:
    // scale =  1: upper bound on activity <= model->row_upper_[row]
    // scale = -1: model->row_lower_[row]  <= lower bound on activity
    if (maxviolation <= primal_feastol) {
      HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
      continue;
    }

    const double smallVal =
        std::max(100 * primal_feastol,
                 primal_feastol * static_cast<double>(maxviolation));
    while (true) {
      if (maxviolation - continuouscontribution <= smallVal || indices.empty())
        break;

      pdqsort(indices.begin(), indices.end(), [&](HighsInt i1, HighsInt i2) {
        return std::make_pair(reducedcost[i1], i1) >
               std::make_pair(reducedcost[i2], i2);
      });

      HighsCDouble lambda = maxviolation - continuouscontribution;

      cover.clear();
      cover.reserve(indices.size());

      for (size_t i = indices.size(); i > 0; --i) {
        HighsInt index = indices[i - 1];
        double delta = upper[index] * reducedcost[index];

        if (upper[index] <= 1000.0 && reducedcost[index] > smallVal &&
            lambda - delta <= smallVal)
          cover.push_back(index);
        else
          lambda -= delta;
      }

      if (cover.empty() || lambda <= smallVal) break;

      HighsInt alpos = *std::min_element(
          cover.begin(), cover.end(), [&](HighsInt i1, HighsInt i2) {
            if (reducedcost[i1] <= 1e-3 || reducedcost[i2] <= 1e-3)
              return reducedcost[i1] > reducedcost[i2];
            return reducedcost[i1] < reducedcost[i2];
          });

      double al = reducedcost[alpos];
      coefs.resize(cover.size());
      double coverrhs = std::max(
          std::ceil(static_cast<double>(lambda / al - primal_feastol)), 1.0);
      HighsCDouble slackupper = -coverrhs;

      double step = kHighsInf;
      for (size_t i = 0; i != cover.size(); ++i) {
        coefs[i] = std::ceil(
            std::min(reducedcost[cover[i]], static_cast<double>(lambda)) / al -
            options->small_matrix_value);
        slackupper += upper[cover[i]] * coefs[i];
        step = std::min(step, reducedcost[cover[i]] / coefs[i]);
      }
      step = std::min(step, static_cast<double>(maxviolation / coverrhs));
      maxviolation -= step * coverrhs;

      HighsInt slackind = reducedcost.size();
      reducedcost.push_back(step);
      upper.push_back(static_cast<double>(slackupper));

      for (size_t i = 0; i != cover.size(); ++i)
        reducedcost[cover[i]] -= step * coefs[i];

      indices.erase(std::remove_if(indices.begin(), indices.end(),
                                   [&](HighsInt i) {
                                     return reducedcost[i] <= primal_feastol;
                                   }),
                    indices.end());
      indices.push_back(slackind);
    }

    double threshold = static_cast<double>(maxviolation + primal_feastol);

    indices.erase(std::remove_if(indices.begin(), indices.end(),
                                 [&](HighsInt i) {
                                   return static_cast<size_t>(i) >=
                                              positions.size() ||
                                          std::abs(reducedcost[i]) <= threshold;
                                 }),
                  indices.end());
    if (indices.empty()) continue;

    auto updateNonZeros = [&](HighsInt row, HighsCDouble& rhs,
                              HighsInt direction) {
      for (HighsInt i : indices) {
        assert(Arow[positions[i]] == row);
        double coefdelta =
            direction * static_cast<double>(reducedcost[i] - maxviolation);
        HighsInt col = Acol[positions[i]];

        if (complementation[i] == -1) {
          rhs += coefdelta * model->col_lower_[col];
          addToMatrix(row, col, coefdelta);
        } else {
          rhs -= coefdelta * model->col_upper_[col];
          addToMatrix(row, col, -coefdelta);
        }
      }
    };

    // update / add non-zeros
    if (scale < 0) {
      HighsCDouble lhs = model->row_lower_[row];
      updateNonZeros(row, lhs, HighsInt{-1});
      model->row_lower_[row] = static_cast<double>(lhs);
    } else {
      HighsCDouble rhs = model->row_upper_[row];
      updateNonZeros(row, rhs, HighsInt{1});
      model->row_upper_[row] = static_cast<double>(rhs);
    }

    num_strengthened += indices.size();
  }

  return Result::kOk;
}